

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdockarealayout.cpp
# Opt level: O2

QDockAreaLayoutInfo * __thiscall QDockAreaLayout::info(QDockAreaLayout *this,QList<int> *path)

{
  QDockAreaLayoutInfo *this_00;
  long in_FS_OFFSET;
  QArrayDataPointer<int> local_30;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = this->docks + *(path->d).ptr;
  if ((path->d).size != 1) {
    QList<int>::mid((QList<int> *)&local_30,path,1,-1);
    this_00 = QDockAreaLayoutInfo::info(this_00,(QList<int> *)&local_30);
    QArrayDataPointer<int>::~QArrayDataPointer(&local_30);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return this_00;
  }
  __stack_chk_fail();
}

Assistant:

QDockAreaLayoutInfo *QDockAreaLayout::info(const QList<int> &path)
{
    Q_ASSERT(!path.isEmpty());
    const int index = path.first();
    Q_ASSERT(index >= 0 && index < QInternal::DockCount);

    if (path.size() == 1)
        return &docks[index];

    return docks[index].info(path.mid(1));
}